

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<kj::ArrayPtr<const_char>_>::setCapacity
          (Vector<kj::ArrayPtr<const_char>_> *this,size_t newSize)

{
  ArrayPtr<const_char> *pAVar1;
  ArrayPtr<const_char> *__dest;
  size_t __n;
  ArrayBuilder<kj::ArrayPtr<const_char>_> local_38;
  
  pAVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)pAVar1 >> 4)) {
    (this->builder).pos = pAVar1 + newSize;
  }
  __dest = _::HeapArrayDisposer::allocateUninitialized<kj::ArrayPtr<char_const>>(newSize);
  local_38.endPtr = __dest + newSize;
  local_38.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pAVar1 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pAVar1;
  local_38.ptr = __dest;
  if (__n != 0) {
    memcpy(__dest,pAVar1,__n);
  }
  local_38.pos = (RemoveConst<kj::ArrayPtr<const_char>_> *)((long)__dest + __n);
  ArrayBuilder<kj::ArrayPtr<const_char>_>::operator=(&this->builder,&local_38);
  ArrayBuilder<kj::ArrayPtr<const_char>_>::dispose(&local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }